

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O0

ErrorTypeEnum Js::JavascriptError::MapParseError(int32 hCode)

{
  undefined4 local_c;
  int32 hCode_local;
  
  if (hCode == -0x7ff60000) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fffb) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5fffa) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5fff9) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fff7) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5fff6) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fff3) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ffe4) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ffd0) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ffcd) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ffcb) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ffc7) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ffc6) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ffc3) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ffbd) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ffba) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ffb5) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ffb4) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5febe) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fe53) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fe52) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fe50) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fe4a) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5fe43) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5fe42) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fe41) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fe40) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fe3f) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5fe3e) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5fe3d) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5fe3b) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fe36) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5fe32) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5fe05) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ec78) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ec77) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec76) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec75) {
    local_c = kjstReferenceError;
  }
  else if (hCode == -0x7ff5ec74) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec73) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec72) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec71) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec70) {
    local_c = kjstReferenceError;
  }
  else if (hCode == -0x7ff5ec6f) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec6e) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec6d) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ec6c) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec6b) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec6a) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec69) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec68) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec67) {
    local_c = kjstSyntaxError;
  }
  else if (hCode == -0x7ff5ec66) {
    local_c = kjstSyntaxError;
  }
  else if (hCode == -0x7ff5ec65) {
    local_c = kjstSyntaxError;
  }
  else if (hCode == -0x7ff5ec64) {
    local_c = kjstSyntaxError;
  }
  else if (hCode == -0x7ff5ec63) {
    local_c = kjstSyntaxError;
  }
  else if (hCode == -0x7ff5ec62) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ec61) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec60) {
    local_c = kjstURIError;
  }
  else if (hCode == -0x7ff5ec5f) {
    local_c = kjstURIError;
  }
  else if (hCode == -0x7ff5ec5e) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ec5d) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ec5c) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec5b) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ec5a) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ec59) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec56) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ec55) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ec54) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec53) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec52) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ec51) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec50) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ec4f) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec4e) {
    local_c = kjstReferenceError;
  }
  else if (hCode == -0x7ff5ec4d) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec4b) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec4a) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec49) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec48) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec47) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec45) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec44) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec43) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec42) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec41) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec40) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec3f) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec3e) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec3d) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec3c) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec3b) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec3a) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec39) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec38) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec37) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec36) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec35) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec34) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec33) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec32) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec31) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec30) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec2f) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec2e) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec2d) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec2c) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec2b) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec2a) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec29) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec28) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec27) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec26) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec25) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec24) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ec23) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ec22) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec21) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec20) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec1f) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec1e) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ec1d) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec1c) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec1b) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec1a) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec18) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec17) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec16) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec15) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec14) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec13) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec12) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ec11) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ec10) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec0f) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec0e) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ec0d) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ec0c) {
    local_c = kjstReferenceError;
  }
  else if (hCode == -0x7ff5ec0b) {
    local_c = kjstReferenceError;
  }
  else if (hCode == -0x7ff5ec0a) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec09) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec08) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ec07) {
    local_c = kjstReferenceError;
  }
  else if (hCode == -0x7ff5ec06) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec05) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec04) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec03) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec02) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ec01) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ec00) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebff) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ebfe) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ebfd) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebfc) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ebfb) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebfa) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebf6) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ebf5) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebf4) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebf3) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebf2) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebf1) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebec) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebeb) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebe7) {
    local_c = kjstReferenceError;
  }
  else if (hCode == -0x7ff5ebe6) {
    local_c = kjstReferenceError;
  }
  else if (hCode == -0x7ff5ebe5) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebe4) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ebe3) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ebb0) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ebaf) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ebae) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5ea20) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ea1f) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ea1e) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ea1d) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5ea1c) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea1b) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea1a) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea19) {
    local_c = kjstSyntaxError;
  }
  else if (hCode == -0x7ff5ea18) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea17) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea16) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea15) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea14) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea13) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea12) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea11) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea10) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea0f) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea0e) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea0d) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea0c) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea0b) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea0a) {
    local_c = kjstAggregateError;
  }
  else if (hCode == -0x7ff5ea05) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea04) {
    local_c = kjstReferenceError;
  }
  else if (hCode == -0x7ff5ea03) {
    local_c = kjstReferenceError;
  }
  else if (hCode == -0x7ff5ea02) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea01) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5ea00) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9ff) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9fe) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9fd) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9fc) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9fb) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9fa) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9f9) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9f8) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9f7) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9f6) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9f5) {
    local_c = kjstSyntaxError;
  }
  else if (hCode == -0x7ff5e9f4) {
    local_c = kjstSyntaxError;
  }
  else if (hCode == -0x7ff5e9f3) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5e9f2) {
    local_c = kjstReferenceError;
  }
  else if (hCode == -0x7ff5e9f1) {
    local_c = kjstSyntaxError;
  }
  else if (hCode == -0x7ff5e9f0) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9ef) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9ee) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9ed) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9ec) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9eb) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9ea) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9e9) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9e8) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9e7) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9e6) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9e5) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9e4) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9e3) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9e2) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9e1) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5e9e0) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5e9df) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5e9de) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9dd) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9dc) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9db) {
    local_c = kjstError;
  }
  else if (hCode == -0x7ff5e9da) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5e9d9) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9d8) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9d7) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9d6) {
    local_c = kjstSyntaxError;
  }
  else if (hCode == -0x7ff5e9d5) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x7ff5e9d4) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9d3) {
    local_c = kjstSyntaxError;
  }
  else if (hCode == -0x7ff5e9d2) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9d1) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9d0) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e9bc) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e958) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e4a8) {
    local_c = kjstWebAssemblyCompileError;
  }
  else if (hCode == -0x7ff5e4a7) {
    local_c = kjstWebAssemblyRuntimeError;
  }
  else if (hCode == -0x7ff5e4a6) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e4a5) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e4a4) {
    local_c = kjstWebAssemblyLinkError;
  }
  else if (hCode == -0x7ff5e4a3) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e4a1) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e4a0) {
    local_c = kjstWebAssemblyLinkError;
  }
  else if (hCode == -0x7ff5e49f) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e49e) {
    local_c = kjstWebAssemblyRuntimeError;
  }
  else if (hCode == -0x7ff5e49d) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e49c) {
    local_c = kjstWebAssemblyLinkError;
  }
  else if (hCode == -0x7ff5e49b) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e49a) {
    local_c = kjstWebAssemblyRuntimeError;
  }
  else if (hCode == -0x7ff5e499) {
    local_c = kjstWebAssemblyLinkError;
  }
  else if (hCode == -0x7ff5e498) {
    local_c = kjstWebAssemblyRuntimeError;
  }
  else if (hCode == -0x7ff5e497) {
    local_c = kjstWebAssemblyRuntimeError;
  }
  else if (hCode == -0x7ff5e496) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e495) {
    local_c = kjstWebAssemblyLinkError;
  }
  else if (hCode == -0x7ff5e494) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e493) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e492) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e491) {
    local_c = kjstWebAssemblyRuntimeError;
  }
  else if (hCode == -0x7ff5e490) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e48f) {
    local_c = kjstWebAssemblyRuntimeError;
  }
  else if (hCode == -0x7ff5e48e) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e48d) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e48c) {
    local_c = kjstWebAssemblyLinkError;
  }
  else if (hCode == -0x7ff5e48b) {
    local_c = kjstWebAssemblyLinkError;
  }
  else if (hCode == -0x7ff5e48a) {
    local_c = kjstWebAssemblyLinkError;
  }
  else if (hCode == -0x7ff5e489) {
    local_c = kjstWebAssemblyRuntimeError;
  }
  else if (hCode == -0x7ff5e488) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e3e0) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff5e37c) {
    local_c = kjstTypeError;
  }
  else if (hCode == -0x7ff57fd4) {
    local_c = kjstRangeError;
  }
  else if (hCode == -0x76fdffff) {
    local_c = kjstError;
  }
  else {
    local_c = kjstSyntaxError;
  }
  return local_c;
}

Assistant:

ErrorTypeEnum JavascriptError::MapParseError(int32 hCode)
    {
        switch (hCode)
        {
#define RT_ERROR_MSG(name, errnum, str1, str2, jst, errorNumSource) \
        case name: \
            return jst; \
        break;
#define RT_PUBLICERROR_MSG(name, errnum, str1, str2, jst, errorNumSource) RT_ERROR_MSG(name, errnum, str1, str2, jst, errorNumSource)
#include "rterrors.h"
#undef RT_PUBLICERROR_MSG
#undef RT_ERROR_MSG
        default:
            return kjstSyntaxError;
        }
    }